

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

uint8_t * dtl_json_reader_lstrip(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *puStack_28;
  int c;
  uint8_t *pNext;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  dtl_json_reader_t *self_local;
  
  puStack_28 = pBegin;
  while( true ) {
    if (pEnd <= puStack_28) {
      return puStack_28;
    }
    uVar1 = *puStack_28;
    iVar2 = bstr_pred_is_whitespace(uVar1);
    if (iVar2 == 0) break;
    if (uVar1 == '\n') {
      self->lineNumber = self->lineNumber + 1;
    }
    puStack_28 = puStack_28 + 1;
  }
  return puStack_28;
}

Assistant:

static const uint8_t *dtl_json_reader_lstrip(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;
   while (pNext < pEnd)
   {
      int c = (int) *pNext;
      if (!bstr_pred_is_whitespace(c)){
         break;
      }
      if (c == '\n')
      {
         self->lineNumber++;
      }
      pNext++;
   }
   return pNext;
}